

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::TryGetValue<Js::FrameDisplay*>
          (BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,FrameDisplay **key,void **value)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  
  lVar2 = *(long *)this;
  uVar1 = 0;
  if (lVar2 != 0) {
    uVar1 = BaseDictionary<void_*,_void_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((uint)((ulong)*key >> 3) | 1,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar3 = *(uint *)(lVar2 + (ulong)uVar1 * 4);
    uVar1 = 0;
    if (-1 < (int)uVar3) {
      lVar2 = *(long *)(this + 8);
      uVar1 = 0;
      do {
        uVar4 = (ulong)uVar3;
        if (*(FrameDisplay **)(lVar2 + 0x10 + uVar4 * 0x18) == *key) {
          if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar1);
            lVar2 = *(long *)(this + 8);
          }
          *value = *(void **)(lVar2 + uVar4 * 0x18);
          return true;
        }
        uVar1 = uVar1 + 1;
        uVar3 = *(uint *)(lVar2 + uVar4 * 0x18 + 8);
      } while (-1 < (int)uVar3);
    }
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar1);
  }
  return false;
}

Assistant:

bool TryGetValue(const TLookup& key, TValue* value) const
        {
            int i = FindEntryWithKey(key);
            if (i >= 0)
            {
                *value = entries[i].Value();
                return true;
            }
            return false;
        }